

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O1

string __thiscall mjs::string_object::string_value(string_object *this)

{
  undefined8 extraout_RDX;
  long in_RSI;
  string sVar1;
  gc_heap *local_20;
  uint32_t local_18;
  
  gc_heap::unsafe_create_from_position<mjs::gc_string>
            ((gc_heap *)&stack0xffffffffffffffe0,(uint32_t)*(undefined8 *)(in_RSI + 8));
  (this->super_native_object).super_object._vptr_object = (_func_int **)local_20;
  *(uint32_t *)&(this->super_native_object).super_object.heap_ = local_18;
  if (local_20 != (gc_heap *)0x0) {
    gc_heap::attach(local_20,(gc_heap_ptr_untyped *)this);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffe0);
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string string_value() const {
        return value_.track(heap());
    }